

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext *dc,ImGuiDockNode *node,int depth)

{
  bool bVar1;
  undefined1 local_58;
  ImGuiID local_54;
  ImGuiID local_50;
  ImVec2ih local_4c;
  ImVec2ih local_48;
  ImVec2ih local_44;
  undefined1 local_40 [8];
  ImGuiDockNodeSettings node_settings;
  int depth_local;
  ImGuiDockNode *node_local;
  ImGuiDockContext *dc_local;
  
  node_settings.Size = (ImVec2ih)depth;
  unique0x1000020a = node;
  ImGuiDockNodeSettings::ImGuiDockNodeSettings((ImGuiDockNodeSettings *)local_40);
  if ((int)node_settings.Size < 0x100) {
    local_40._0_4_ = stack0xffffffffffffffe8->ID;
    if (stack0xffffffffffffffe8->ParentNode == (ImGuiDockNode *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = stack0xffffffffffffffe8->ParentNode->ID;
    }
    local_40._4_4_ = local_50;
    bVar1 = ImGuiDockNode::IsDockSpace(stack0xffffffffffffffe8);
    if (((bVar1) && (stack0xffffffffffffffe8->HostWindow != (ImGuiWindow *)0x0)) &&
       (stack0xffffffffffffffe8->HostWindow->ParentWindow != (ImGuiWindow *)0x0)) {
      local_54 = stack0xffffffffffffffe8->HostWindow->ParentWindow->ID;
    }
    else {
      local_54 = 0;
    }
    node_settings.ID = local_54;
    node_settings.ParentNodeId = stack0xffffffffffffffe8->SelectedTabId;
    bVar1 = ImGuiDockNode::IsSplitNode(stack0xffffffffffffffe8);
    if (bVar1) {
      local_58 = (undefined1)stack0xffffffffffffffe8->SplitAxis;
    }
    else {
      local_58 = 0xff;
    }
    node_settings.ParentWindowId._0_1_ = local_58;
    node_settings.ParentWindowId._1_1_ = (undefined1)node_settings.Size.x;
    node_settings.SelectedTabId = stack0xffffffffffffffe8->LocalFlags & 0xc1fc20;
    ImVec2ih::ImVec2ih(&local_44,&stack0xffffffffffffffe8->Pos);
    node_settings._16_4_ = local_44;
    ImVec2ih::ImVec2ih(&local_48,&stack0xffffffffffffffe8->Size);
    node_settings.Flags._0_2_ = local_48.x;
    node_settings.Flags._2_2_ = local_48.y;
    ImVec2ih::ImVec2ih(&local_4c,&stack0xffffffffffffffe8->SizeRef);
    node_settings.Pos = local_4c;
    ImVector<ImGuiDockNodeSettings>::push_back(&dc->NodesSettings,(ImGuiDockNodeSettings *)local_40)
    ;
    if (stack0xffffffffffffffe8->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockSettingsHandler_DockNodeToSettings
                (dc,stack0xffffffffffffffe8->ChildNodes[0],(int)node_settings.Size + 1);
    }
    if (stack0xffffffffffffffe8->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockSettingsHandler_DockNodeToSettings
                (dc,stack0xffffffffffffffe8->ChildNodes[1],(int)node_settings.Size + 1);
    }
    return;
  }
  __assert_fail("depth < (1 << (sizeof(node_settings.Depth) << 3))",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x3faf,
                "void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext *, ImGuiDockNode *, int)"
               );
}

Assistant:

static void DockSettingsHandler_DockNodeToSettings(ImGuiDockContext* dc, ImGuiDockNode* node, int depth)
{
    ImGuiDockNodeSettings node_settings;
    IM_ASSERT(depth < (1 << (sizeof(node_settings.Depth) << 3)));
    node_settings.ID = node->ID;
    node_settings.ParentNodeId = node->ParentNode ? node->ParentNode->ID : 0;
    node_settings.ParentWindowId = (node->IsDockSpace() && node->HostWindow && node->HostWindow->ParentWindow) ? node->HostWindow->ParentWindow->ID : 0;
    node_settings.SelectedTabId = node->SelectedTabId;
    node_settings.SplitAxis = (signed char)(node->IsSplitNode() ? node->SplitAxis : ImGuiAxis_None);
    node_settings.Depth = (char)depth;
    node_settings.Flags = (node->LocalFlags & ImGuiDockNodeFlags_SavedFlagsMask_);
    node_settings.Pos = ImVec2ih(node->Pos);
    node_settings.Size = ImVec2ih(node->Size);
    node_settings.SizeRef = ImVec2ih(node->SizeRef);
    dc->NodesSettings.push_back(node_settings);
    if (node->ChildNodes[0])
        DockSettingsHandler_DockNodeToSettings(dc, node->ChildNodes[0], depth + 1);
    if (node->ChildNodes[1])
        DockSettingsHandler_DockNodeToSettings(dc, node->ChildNodes[1], depth + 1);
}